

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O0

BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> * __thiscall
gmlc::containers::
DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
          (DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
           *this,InterfaceHandle *searchValue)

{
  bool bVar1;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> *in_RDI;
  const_iterator fnd;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> *this_00;
  StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *in_stack_ffffffffffffffc0;
  StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *in_stack_ffffffffffffffd0;
  _Self local_20;
  _Self local_18 [3];
  
  this_00 = in_RDI;
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
       ::find((map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
               *)in_RDI,(key_type *)0x2a7662);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
       ::end((map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
              *)in_RDI);
  bVar1 = std::operator==(local_18,&local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
              (in_stack_ffffffffffffffd0);
  }
  else {
    StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::begin
              (in_stack_ffffffffffffffc0);
    std::_Rb_tree_const_iterator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>::
    operator->((_Rb_tree_const_iterator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_> *)
               0x2a76ad);
    BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::operator+
              (this_00,(ptrdiff_t *)in_RDI);
  }
  return this_00;
}

Assistant:

auto find(const searchType2& searchValue) const
        {
            auto fnd = lookup2.find(searchValue);
            if (fnd != lookup2.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }